

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int __thiscall
fmt::v7::
basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
get_id<char>(basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             *this,basic_string_view<char> name)

{
  basic_string_view<char> rhs;
  bool bVar1;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_68;
  basic_string_view<char> local_48;
  ulong local_38;
  size_t i;
  named_arg_value<char> *named_args;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *this_local;
  basic_string_view<char> name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)name.data_;
  named_args = (named_arg_value<char> *)this;
  bVar1 = has_named_args(this);
  if (bVar1) {
    bVar1 = is_packed(this);
    if (bVar1) {
      local_68 = (this->field_1).values_ + -1;
    }
    else {
      local_68 = (this->field_1).values_ + -2;
    }
    i = (size_t)local_68;
    for (local_38 = 0; local_38 < *(ulong *)(i + 8); local_38 = local_38 + 1) {
      basic_string_view<char>::basic_string_view(&local_48,*(char **)(*(long *)i + local_38 * 0x10))
      ;
      rhs.size_ = (size_t)name_local.data_;
      rhs.data_ = (char *)this_local;
      bVar1 = operator==(local_48,rhs);
      if (bVar1) {
        return *(int *)(*(long *)i + local_38 * 0x10 + 8);
      }
    }
  }
  return -1;
}

Assistant:

int get_id(basic_string_view<Char> name) const {
    if (!has_named_args()) return -1;
    const auto& named_args =
        (is_packed() ? values_[-1] : args_[-1].value_).named_args;
    for (size_t i = 0; i < named_args.size; ++i) {
      if (named_args.data[i].name == name) return named_args.data[i].id;
    }
    return -1;
  }